

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O1

void __thiscall TApp_IniOutputFlag_Test::TestBody(TApp_IniOutputFlag_Test *this)

{
  App *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  string str;
  int q;
  int v;
  char local_328 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  AssertHelper local_318 [2];
  undefined1 local_308 [16];
  undefined1 *local_2f8;
  long local_2f0;
  undefined1 local_2e8 [16];
  string local_2d8;
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  string local_258;
  int local_238;
  int local_234;
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--simple","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  this_00 = &(this->super_TApp).app;
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_50,&local_234,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--nothing","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  CLI::App::add_flag(this_00,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"--onething","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  CLI::App::add_flag(this_00,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"--something","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  CLI::App::add_flag<int,_(CLI::detail::enabler)0>(this_00,&local_110,&local_238,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  paVar1 = &local_2d8.field_2;
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"--simple=3","");
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"--onething","");
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"--something","");
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"--something","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&local_2d8,&local_258);
  lVar3 = 0;
  do {
    if (local_268 + lVar3 != *(undefined1 **)((long)local_278 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_278 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x80);
  TApp::run(&this->super_TApp);
  pcVar4 = "";
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"","");
  CLI::App::config_to_str(&local_258,this_00,false,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"simple=3","");
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_2f8,local_2f8 + local_2f0);
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_190,local_190 + local_188);
  local_318[0].data_ = (AssertHelperData *)local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_328,(char *)local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  if (local_318[0].data_ != (AssertHelperData *)local_308) {
    operator_delete(local_318[0].data_);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  if (local_328[0] == '\0') {
    testing::Message::Message((Message *)&local_2d8);
    if (local_320.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x25c,pcVar4);
    testing::internal::AssertHelper::operator=(local_318,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_2d8._M_dataplus._M_p + 8))();
      }
      local_2d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"nothing","");
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_2f8,local_2f8 + local_2f0);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_1d0,local_1d0 + local_1c8);
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_1b0,local_1b0 + local_1a8);
  local_318[0].data_ = (AssertHelperData *)local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
  ::operator()(local_328,(char *)local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  if (local_318[0].data_ != (AssertHelperData *)local_308) {
    operator_delete(local_318[0].data_);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  if (local_328[0] == '\0') {
    testing::Message::Message((Message *)&local_2d8);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x25d,pcVar4);
    testing::internal::AssertHelper::operator=(local_318,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_2d8._M_dataplus._M_p + 8))();
      }
      local_2d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"onething=true","");
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_2f8,local_2f8 + local_2f0);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_1f0,local_1f0 + local_1e8);
  local_318[0].data_ = (AssertHelperData *)local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_328,(char *)local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  if (local_318[0].data_ != (AssertHelperData *)local_308) {
    operator_delete(local_318[0].data_);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  if (local_328[0] == '\0') {
    testing::Message::Message((Message *)&local_2d8);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x25e,pcVar4);
    testing::internal::AssertHelper::operator=(local_318,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_2d8._M_dataplus._M_p + 8))();
      }
      local_2d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"something=2","");
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_2f8,local_2f8 + local_2f0);
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_210,local_210 + local_208);
  local_318[0].data_ = (AssertHelperData *)local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_328,(char *)local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  if (local_318[0].data_ != (AssertHelperData *)local_308) {
    operator_delete(local_318[0].data_);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  if (local_328[0] == '\0') {
    testing::Message::Message((Message *)&local_2d8);
    if (local_320.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x25f,pcVar4);
    testing::internal::AssertHelper::operator=(local_318,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_2d8._M_dataplus._M_p + 8))();
      }
      local_2d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar4 = "";
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"","");
  CLI::App::config_to_str(&local_2d8,this_00,true,&local_170);
  std::__cxx11::string::operator=((string *)&local_258,(string *)&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"nothing","");
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_2f8,local_2f8 + local_2f0);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2d8,local_230,local_230 + local_228);
  local_318[0].data_ = (AssertHelperData *)local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_328,(char *)local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  if (local_318[0].data_ != (AssertHelperData *)local_308) {
    operator_delete(local_318[0].data_);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  if (local_328[0] == '\0') {
    testing::Message::Message((Message *)&local_2d8);
    if (local_320.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_320.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x262,pcVar4);
    testing::internal::AssertHelper::operator=(local_318,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_2d8._M_dataplus._M_p + 8))();
      }
      local_2d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, IniOutputFlag) {

    int v, q;
    app.add_option("--simple", v);
    app.add_flag("--nothing");
    app.add_flag("--onething");
    app.add_flag("--something", q);

    args = {"--simple=3", "--onething", "--something", "--something"};

    run();

    std::string str = app.config_to_str();
    EXPECT_THAT(str, HasSubstr("simple=3"));
    EXPECT_THAT(str, Not(HasSubstr("nothing")));
    EXPECT_THAT(str, HasSubstr("onething=true"));
    EXPECT_THAT(str, HasSubstr("something=2"));

    str = app.config_to_str(true);
    EXPECT_THAT(str, HasSubstr("nothing"));
}